

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_4::Validator::OnCatchExpr(Validator *this,TryExpr *param_1,Catch *catch_)

{
  Result RVar1;
  Var VStack_68;
  
  Var::Var(&VStack_68,&catch_->var);
  RVar1 = SharedValidator::OnCatch
                    (&this->validator_,&catch_->loc,&VStack_68,
                     (catch_->var).field_2.index_ == 0xffffffff && (catch_->var).type_ == Index);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&VStack_68);
  return (Result)Ok;
}

Assistant:

Result Validator::OnCatchExpr(TryExpr*, Catch* catch_) {
  result_ |= validator_.OnCatch(catch_->loc, catch_->var, catch_->IsCatchAll());
  return Result::Ok;
}